

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  uint32_t i;
  uint32_t val;
  Roaring r1;
  roaring_array_t local_38;
  
  local_38.keys = (uint16_t *)0x0;
  local_38.typecodes = (uint8_t *)0x0;
  local_38.size = 0;
  local_38.allocation_size = 0;
  local_38.containers = (void **)0x0;
  local_38.flags = '\0';
  local_38._33_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_38,0);
  val = 100;
  do {
    roaring_bitmap_add((roaring_bitmap_t *)&local_38,val);
    val = val + 1;
  } while (val != 1000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cardinality = ",0xe);
  roaring_bitmap_get_cardinality((roaring_bitmap_t *)&local_38);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  roaring_bitmap_clear((roaring_bitmap_t *)&local_38);
  return 0;
}

Assistant:

int main() {
  Roaring r1;
  for (uint32_t i = 100; i < 1000; i++) {
    r1.add(i);
  }
  std::cout << "cardinality = " << r1.cardinality() << std::endl;

  return 0;
}